

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeCoTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  Status stat;
  int iVar1;
  pointer pnVar2;
  ostream *poVar3;
  long lVar4;
  type_conflict5 tVar5;
  int iVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  SPxOut *pSVar7;
  long lVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  char *t;
  pointer pnVar11;
  uint i;
  byte bVar12;
  long local_1d8;
  Verbosity old_verbosity_1;
  cpp_dec_float<200U,_int,_void> *local_1c8;
  DIdxSet *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar12 = 0;
  leavetol(&pricingTol,this);
  this->m_pricingViolUpToDate = true;
  local_1c8 = &(this->m_pricingViol).m_backend;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(local_1c8,0);
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  local_1c0 = &this->infeasibilities;
  local_1d8 = (long)(this->thecovectors->set).thenum;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            (&result.m_backend,&(this->sparsePricingFactor).m_backend,&local_1d8);
  iVar6 = boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&result.m_backend);
  i = (this->thecovectors->set).thenum;
  lVar4 = 0x1c;
  while (0 < (int)i) {
    i = i - 1;
    stat = ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.costat)->data[i];
    if (this->theRep * stat < 1) {
      coTest((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&result.m_backend,this,i,stat);
      pnVar2 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar9 = &result.m_backend;
      pnVar11 = pnVar2 + i;
      for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar12 * -8 + 4);
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar12 * -2 + 1) * 4);
      }
      pnVar2[i].m_backend.exp = result.m_backend.exp;
      pnVar2[i].m_backend.neg = result.m_backend.neg;
      pnVar2[i].m_backend.fpclass = result.m_backend.fpclass;
      pnVar2[i].m_backend.prec_elem = result.m_backend.prec_elem;
      a = (this->theCoTest).val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start + i;
      if (this->remainingRoundsEnter == 0) {
        pnVar10 = &pricingTol;
        pcVar9 = &result.m_backend;
        for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar9->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + ((ulong)bVar12 * -2 + 1) * 4);
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar12 * -8 + 4);
        }
        result.m_backend.exp = pricingTol.m_backend.exp;
        result.m_backend.neg = pricingTol.m_backend.neg;
        result.m_backend.fpclass = pricingTol.m_backend.fpclass;
        result.m_backend.prec_elem = pricingTol.m_backend.prec_elem;
        if (pricingTol.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(pricingTol.m_backend.neg ^ 1);
        }
        tVar5 = boost::multiprecision::operator<
                          (a,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
        if (tVar5) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (local_1c8,
                     &(this->theCoTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          DIdxSet::addIdx(local_1c0,i);
          (this->isInfeasible).data[i] = 1;
          this->m_numViol = this->m_numViol + 1;
        }
        else {
          (this->isInfeasible).data[i] = 0;
        }
        if (iVar6 < (this->infeasibilities).super_IdxSet.num) {
          pSVar7 = this->spxout;
          if ((pSVar7 != (SPxOut *)0x0) && (3 < (int)pSVar7->m_verbosity)) {
            result.m_backend.data._M_elems[0] = pSVar7->m_verbosity;
            local_1d8 = CONCAT44(local_1d8._4_4_,4);
            (*pSVar7->_vptr_SPxOut[2])(pSVar7,&local_1d8);
            pSVar7 = soplex::operator<<(this->spxout," --- using dense pricing");
            std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
            (*this->spxout->_vptr_SPxOut[2])();
          }
          this->remainingRoundsEnter = 5;
          this->sparsePricingEnter = false;
          (this->infeasibilities).super_IdxSet.num = 0;
        }
      }
      else {
        pnVar10 = &pricingTol;
        pcVar9 = &result.m_backend;
        for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pcVar9->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + ((ulong)bVar12 * -2 + 1) * 4);
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar12 * -8 + 4);
        }
        result.m_backend.exp = pricingTol.m_backend.exp;
        result.m_backend.neg = pricingTol.m_backend.neg;
        result.m_backend.fpclass = pricingTol.m_backend.fpclass;
        result.m_backend.prec_elem = pricingTol.m_backend.prec_elem;
        if (pricingTol.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(pricingTol.m_backend.neg ^ 1);
        }
        tVar5 = boost::multiprecision::operator<
                          (a,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
        if (tVar5) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (local_1c8,
                     &(this->theCoTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          this->m_numViol = this->m_numViol + 1;
        }
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this->theCoTest).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,0);
      if (this->remainingRoundsEnter == 0) {
        (this->isInfeasible).data[i] = 0;
      }
    }
  }
  iVar1 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar1 == 0) && (this->sparsePricingEnter == false)) {
    this->remainingRoundsEnter = this->remainingRoundsEnter + -1;
  }
  else if ((iVar1 <= iVar6) && (this->sparsePricingEnter == false)) {
    pSVar7 = this->spxout;
    if ((pSVar7 != (SPxOut *)0x0) &&
       (old_verbosity_1 = pSVar7->m_verbosity, 3 < (int)old_verbosity_1)) {
      result.m_backend.data._M_elems[0] = 4;
      (*pSVar7->_vptr_SPxOut[2])();
      pSVar7 = this->spxout;
      iVar6 = *(int *)(pSVar7->m_streams[pSVar7->m_verbosity] +
                      *(long *)(*(long *)pSVar7->m_streams[pSVar7->m_verbosity] + -0x18) + 8);
      t = " --- using sparse pricing, ";
      if (this->hyperPricingEnter != false) {
        t = " --- using hypersparse pricing, ";
      }
      soplex::operator<<(pSVar7,t);
      pSVar7 = soplex::operator<<(this->spxout,"sparsity: ");
      poVar3 = pSVar7->m_streams[pSVar7->m_verbosity];
      lVar4 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar4 + -0x18) + 0x10) = 6;
      *(uint *)(poVar3 + *(long *)(lVar4 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar4 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar4 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&result.m_backend,(long)(this->infeasibilities).super_IdxSet.num,(type *)0x0);
      local_1d8 = (long)(this->thecovectors->set).thenum;
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 0x1c;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems[6] = 0;
      local_b8.data._M_elems[7] = 0;
      local_b8.data._M_elems[8] = 0;
      local_b8.data._M_elems[9] = 0;
      local_b8.data._M_elems[10] = 0;
      local_b8.data._M_elems[0xb] = 0;
      local_b8.data._M_elems[0xc] = 0;
      local_b8.data._M_elems[0xd] = 0;
      local_b8.data._M_elems[0xe] = 0;
      local_b8.data._M_elems[0xf] = 0;
      local_b8.data._M_elems[0x18] = 0;
      local_b8.data._M_elems[0x19] = 0;
      local_b8.data._M_elems._104_5_ = 0;
      local_b8.data._M_elems[0x1b]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      local_b8.data._M_elems[0x10] = 0;
      local_b8.data._M_elems[0x11] = 0;
      local_b8.data._M_elems[0x12] = 0;
      local_b8.data._M_elems[0x13] = 0;
      local_b8.data._M_elems[0x14] = 0;
      local_b8.data._M_elems[0x15] = 0;
      local_b8.data._M_elems[0x16] = 0;
      local_b8.data._M_elems[0x17] = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                (&local_b8,&result.m_backend,&local_1d8);
      pSVar7 = soplex::operator<<(pSVar7,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_b8);
      poVar3 = pSVar7->m_streams[pSVar7->m_verbosity];
      lVar4 = *(long *)poVar3;
      lVar8 = *(long *)(lVar4 + -0x18);
      *(uint *)(poVar3 + lVar8 + 0x18) = *(uint *)(poVar3 + lVar8 + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar3 + *(long *)(lVar4 + -0x18) + 8) = (long)iVar6;
      std::endl<char,std::char_traits<char>>(poVar3);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity_1);
    }
    this->sparsePricingEnter = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}